

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFPageInput.cpp
# Opt level: O1

PDFRectangle * __thiscall
PDFPageInput::GetCropBox(PDFRectangle *__return_storage_ptr__,PDFPageInput *this)

{
  PDFDictionary *inDictionary;
  EStatusCode EVar1;
  PDFObject *inOriginal;
  PDFPageInput *this_00;
  PDFObjectCastPtr<PDFArray> cropBox;
  RefCountPtr<PDFArray> local_50;
  undefined1 local_40 [32];
  
  PDFRectangle::PDFRectangle(__return_storage_ptr__);
  inDictionary = (this->mPageObject).super_RefCountPtr<PDFDictionary>.mValue;
  local_40._0_8_ = (PDFPageInput *)(local_40 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"CropBox","");
  inOriginal = QueryInheritedValue(this,inDictionary,(string *)local_40);
  local_50.mValue = PDFObjectCast<PDFArray>(inOriginal);
  local_50._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a97e8;
  this_00 = (PDFPageInput *)local_40._0_8_;
  if ((PDFPageInput *)local_40._0_8_ != (PDFPageInput *)(local_40 + 0x10)) {
    operator_delete((void *)local_40._0_8_,local_40._16_8_ + 1);
  }
  EVar1 = SetPDFRectangleFromPDFArray(this_00,local_50.mValue,__return_storage_ptr__);
  if (EVar1 != eSuccess) {
    GetMediaBox((PDFRectangle *)local_40,this);
    __return_storage_ptr__->UpperRightX = (double)local_40._16_8_;
    __return_storage_ptr__->UpperRightY = (double)local_40._24_8_;
    __return_storage_ptr__->LowerLeftX = (double)local_40._0_8_;
    __return_storage_ptr__->LowerLeftY = (double)local_40._8_8_;
    PDFRectangle::~PDFRectangle((PDFRectangle *)local_40);
  }
  RefCountPtr<PDFArray>::~RefCountPtr(&local_50);
  return __return_storage_ptr__;
}

Assistant:

PDFRectangle PDFPageInput::GetCropBox()
{
    PDFRectangle result;
    PDFObjectCastPtr<PDFArray> cropBox(QueryInheritedValue(mPageObject.GetPtr(),"CropBox"));
    
    if(SetPDFRectangleFromPDFArray(cropBox.GetPtr(),result) != eSuccess)
        result = GetMediaBox();
    return result;
}